

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

AddrRange * addrrange_intersection(AddrRange *__return_storage_ptr__,AddrRange r1,AddrRange r2)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  AddrRange *pAVar4;
  ulong in_RCX;
  long in_RDX;
  ulong in_RSI;
  long in_R8;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar7 = (ulong)r1.start;
  lVar2 = r1.start._8_8_;
  if ((SBORROW8(r1.start._8_8_,in_RDX) !=
      SBORROW8(r1.start._8_8_ - in_RDX,(ulong)((ulong)r1.start < in_RSI))) !=
      (long)((r1.start._8_8_ - in_RDX) - (ulong)((ulong)r1.start < in_RSI)) < 0) {
    uVar7 = in_RSI;
    lVar2 = in_RDX;
  }
  lVar5 = in_R8 + in_RDX + (ulong)CARRY8(in_RCX,in_RSI);
  lVar3 = r1.start._8_8_ + r1.size._8_8_ + (ulong)CARRY8((ulong)r1.start,(ulong)r1.size);
  uVar1 = (ulong)(in_RCX + in_RSI < (ulong)r1.start + (ulong)r1.size);
  uVar6 = (ulong)r1.start + (ulong)r1.size;
  if ((SBORROW8(lVar5,lVar3) != SBORROW8(lVar5 - lVar3,uVar1)) !=
      (long)((lVar5 - lVar3) - uVar1) < 0) {
    uVar6 = in_RCX + in_RSI;
    lVar3 = lVar5;
  }
  pAVar4 = (AddrRange *)((lVar3 - lVar2) - (ulong)(uVar6 < uVar7));
  *(long *)((long)&__return_storage_ptr__->start + 8) = lVar2;
  *(ulong *)&__return_storage_ptr__->start = uVar7;
  *(ulong *)&__return_storage_ptr__->size = uVar6 - uVar7;
  *(AddrRange **)((long)&__return_storage_ptr__->size + 8) = pAVar4;
  return pAVar4;
}

Assistant:

static AddrRange addrrange_intersection(AddrRange r1, AddrRange r2)
{
    Int128 start = int128_max(r1.start, r2.start);
    Int128 end = int128_min(addrrange_end(r1), addrrange_end(r2));
    return addrrange_make(start, int128_sub(end, start));
}